

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_rg_etc1.cpp
# Opt level: O0

bool __thiscall
crnlib::rg_etc1::etc1_optimizer::evaluate_solution
          (etc1_optimizer *this,etc1_solution_coordinates *coords,potential_solution *trial_solution
          ,potential_solution *pBest_solution)

{
  int iVar1;
  int iVar2;
  long in_RCX;
  color_quad_u8 *in_RDX;
  color_quad_u8 *in_RSI;
  long *in_RDI;
  undefined1 uVar3;
  bool success;
  uint trial_error;
  uint best_error;
  uint best_selector_index;
  color_quad_u8 *src_pixel;
  uint c;
  color_quad_u8 *pSrc_pixels;
  uint64 total_error;
  int yd;
  uint s;
  color_quad_u8 block_colors [4];
  int *pInten_table;
  uint inten_table;
  uint n;
  color_quad_u8 base_color;
  int db;
  int dg;
  int dr;
  undefined4 in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff2c;
  int in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff34;
  int in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  int in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff44;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  anon_union_4_3_dd316fa8_for_color_quad_u8_0 *local_a0;
  bool local_8d;
  uint local_88;
  uint local_74;
  byte *local_70;
  ulong local_68;
  uint local_5c;
  anon_union_4_3_dd316fa8_for_color_quad_u8_0 local_58;
  byte local_54;
  byte local_53;
  byte local_52;
  byte local_50;
  byte local_4f;
  byte local_4e;
  byte local_4c;
  byte local_4b;
  byte local_4a;
  undefined1 *local_48;
  anon_union_4_3_dd316fa8_for_color_quad_u8_0 local_40;
  undefined4 local_3c;
  int local_34;
  int local_30;
  int local_2c;
  long local_28;
  color_quad_u8 *local_20;
  color_quad_u8 *local_18;
  
  in_RDX[8].field_0.field_0.r = '\0';
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  if ((*(byte *)(*in_RDI + 0x30) & 1) != 0) {
    local_2c = (uint)(in_RSI->field_0).field_0.r - (uint)*(byte *)(*in_RDI + 0x2c);
    local_30 = (uint)(in_RSI->field_0).field_0.g - (uint)*(byte *)(*in_RDI + 0x2d);
    local_34 = (uint)(in_RSI->field_0).field_0.b - (uint)*(byte *)(*in_RDI + 0x2e);
    iVar1 = minimum<int>(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30,
                         in_stack_ffffffffffffff2c);
    if ((iVar1 < -4) ||
       (iVar1 = maximum<int>(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30,
                             in_stack_ffffffffffffff2c), 3 < iVar1)) {
      return false;
    }
  }
  etc1_solution_coordinates::get_scaled_color
            ((etc1_solution_coordinates *)
             CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  local_3c = 8;
  *(undefined8 *)(local_20 + 6) = 0xffffffffffffffff;
  local_40.m_u32 = 0;
  do {
    if (7 < local_40.m_u32) {
      color_quad_u8::operator=(local_20,local_18);
      local_20[2].field_0.field_0.r = *(byte *)(*in_RDI + 0x18) & 1;
      local_8d = false;
      if ((local_28 != 0) &&
         (local_8d = *(ulong *)(local_20 + 6) < *(ulong *)(local_28 + 0x18), local_8d)) {
        potential_solution::operator=
                  ((potential_solution *)
                   CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                   (potential_solution *)
                   CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
      }
      return local_8d;
    }
    local_48 = g_etc1_inten_tables + (ulong)local_40.m_u32 * 0x10;
    local_a0 = &local_58;
    do {
      color_quad_u8::color_quad_u8((color_quad_u8 *)&local_a0->field_0);
      local_a0 = local_a0 + 1;
    } while (local_a0 != (anon_union_4_3_dd316fa8_for_color_quad_u8_0 *)&local_48);
    for (local_5c = 0; local_5c < 4; local_5c = local_5c + 1) {
      color_quad_u8::set((color_quad_u8 *)
                         CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                         in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38,
                         in_stack_ffffffffffffff34,in_stack_ffffffffffffff30);
    }
    local_68 = 0;
    local_70 = *(byte **)(*in_RDI + 0x10);
    for (local_74 = 0; local_74 < 8; local_74 = local_74 + 1) {
      in_stack_ffffffffffffff40 = square<int>((uint)*local_70 - (uint)local_58.field_0.r);
      in_stack_ffffffffffffff44 = square<int>((uint)local_70[1] - (uint)local_58.field_0.g);
      in_stack_ffffffffffffff44 = in_stack_ffffffffffffff40 + in_stack_ffffffffffffff44;
      iVar1 = square<int>((uint)local_70[2] - (uint)local_58.field_0.b);
      local_88 = in_stack_ffffffffffffff44 + iVar1;
      iVar2 = square<int>((uint)*local_70 - (uint)local_54);
      iVar1 = square<int>((uint)local_70[1] - (uint)local_53);
      iVar2 = iVar2 + iVar1;
      iVar1 = square<int>((uint)local_70[2] - (uint)local_52);
      uVar3 = (uint)(iVar2 + iVar1) < local_88;
      if ((bool)uVar3) {
        local_88 = iVar2 + iVar1;
      }
      in_stack_ffffffffffffff38 = square<int>((uint)*local_70 - (uint)local_50);
      in_stack_ffffffffffffff3c = square<int>((uint)local_70[1] - (uint)local_4f);
      in_stack_ffffffffffffff3c = in_stack_ffffffffffffff38 + in_stack_ffffffffffffff3c;
      iVar1 = square<int>((uint)local_70[2] - (uint)local_4e);
      if ((uint)(in_stack_ffffffffffffff3c + iVar1) < local_88) {
        uVar3 = 2;
        local_88 = in_stack_ffffffffffffff3c + iVar1;
      }
      in_stack_ffffffffffffff30 = square<int>((uint)*local_70 - (uint)local_4c);
      iVar1 = square<int>((uint)local_70[1] - (uint)local_4b);
      in_stack_ffffffffffffff34 = in_stack_ffffffffffffff30 + iVar1;
      iVar1 = square<int>((uint)local_70[2] - (uint)local_4a);
      if ((uint)(in_stack_ffffffffffffff34 + iVar1) < local_88) {
        uVar3 = 3;
        local_88 = in_stack_ffffffffffffff34 + iVar1;
      }
      *(undefined1 *)((long)in_RDI + (ulong)local_74 + 0xf0) = uVar3;
      local_68 = local_88 + local_68;
      if (*(ulong *)(local_20 + 6) <= local_68) break;
      local_70 = local_70 + 4;
    }
    if (local_68 < *(ulong *)(local_20 + 6)) {
      *(ulong *)(local_20 + 6) = local_68;
      local_20[1].field_0 = local_40;
      *(long *)(local_20 + 3) = in_RDI[0x1e];
      local_20[8].field_0.field_0.r = '\x01';
    }
    local_40.field_0 = local_40.field_0 + 1;
  } while( true );
}

Assistant:

bool etc1_optimizer::evaluate_solution(const etc1_solution_coordinates& coords, potential_solution& trial_solution, potential_solution* pBest_solution) {
  trial_solution.m_valid = false;

  if (m_pParams->m_constrain_against_base_color5) {
    const int dr = coords.m_unscaled_color.r - m_pParams->m_base_color5.r;
    const int dg = coords.m_unscaled_color.g - m_pParams->m_base_color5.g;
    const int db = coords.m_unscaled_color.b - m_pParams->m_base_color5.b;

    if ((rg_etc1::minimum(dr, dg, db) < cETC1ColorDeltaMin) || (rg_etc1::maximum(dr, dg, db) > cETC1ColorDeltaMax))
      return false;
  }

  const color_quad_u8 base_color(coords.get_scaled_color());

  const uint n = 8;

  trial_solution.m_error = cUINT64_MAX;

  for (uint inten_table = 0; inten_table < cETC1IntenModifierValues; inten_table++) {
    const int* pInten_table = g_etc1_inten_tables[inten_table];

    color_quad_u8 block_colors[4];
    for (uint s = 0; s < 4; s++) {
      const int yd = pInten_table[s];
      block_colors[s].set(base_color.r + yd, base_color.g + yd, base_color.b + yd, 0);
    }

    uint64 total_error = 0;

    const color_quad_u8* pSrc_pixels = m_pParams->m_pSrc_pixels;
    for (uint c = 0; c < n; c++) {
      const color_quad_u8& src_pixel = *pSrc_pixels++;

      uint best_selector_index = 0;
      uint best_error = rg_etc1::square(src_pixel.r - block_colors[0].r) + rg_etc1::square(src_pixel.g - block_colors[0].g) + rg_etc1::square(src_pixel.b - block_colors[0].b);

      uint trial_error = rg_etc1::square(src_pixel.r - block_colors[1].r) + rg_etc1::square(src_pixel.g - block_colors[1].g) + rg_etc1::square(src_pixel.b - block_colors[1].b);
      if (trial_error < best_error) {
        best_error = trial_error;
        best_selector_index = 1;
      }

      trial_error = rg_etc1::square(src_pixel.r - block_colors[2].r) + rg_etc1::square(src_pixel.g - block_colors[2].g) + rg_etc1::square(src_pixel.b - block_colors[2].b);
      if (trial_error < best_error) {
        best_error = trial_error;
        best_selector_index = 2;
      }

      trial_error = rg_etc1::square(src_pixel.r - block_colors[3].r) + rg_etc1::square(src_pixel.g - block_colors[3].g) + rg_etc1::square(src_pixel.b - block_colors[3].b);
      if (trial_error < best_error) {
        best_error = trial_error;
        best_selector_index = 3;
      }

      m_temp_selectors[c] = static_cast<uint8>(best_selector_index);

      total_error += best_error;
      if (total_error >= trial_solution.m_error)
        break;
    }

    if (total_error < trial_solution.m_error) {
      trial_solution.m_error = total_error;
      trial_solution.m_coords.m_inten_table = inten_table;
      memcpy(trial_solution.m_selectors, m_temp_selectors, 8);
      trial_solution.m_valid = true;
    }
  }
  trial_solution.m_coords.m_unscaled_color = coords.m_unscaled_color;
  trial_solution.m_coords.m_color4 = m_pParams->m_use_color4;

  bool success = false;
  if (pBest_solution) {
    if (trial_solution.m_error < pBest_solution->m_error) {
      *pBest_solution = trial_solution;
      success = true;
    }
  }

  return success;
}